

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpec::Pattern::Pattern(Pattern *this,string *name)

{
  string *name_local;
  Pattern *this_local;
  
  this->_vptr_Pattern = (_func_int **)&PTR__Pattern_0025c490;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  return;
}

Assistant:

TestSpec::Pattern::Pattern( std::string const& name )
    : m_name( name )
    {}